

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O3

void Fraig_TablePrintStatsS(Fraig_Man_t *pMan)

{
  Fraig_HashTable_t *pFVar1;
  Fraig_Node_t *pFVar2;
  uint uVar3;
  ulong uVar4;
  
  pFVar1 = pMan->pTableS;
  printf("Structural table. Table size = %d. Number of entries = %d.\n",(ulong)(uint)pFVar1->nBins,
         (ulong)(uint)pFVar1->nEntries);
  if (0 < pFVar1->nBins) {
    uVar4 = 0;
    do {
      pFVar2 = pFVar1->pBins[uVar4];
      if (pFVar2 != (Fraig_Node_t *)0x0) {
        uVar3 = 0;
        do {
          pFVar2 = pFVar2->pNextS;
          uVar3 = uVar3 - 1;
        } while (pFVar2 != (Fraig_Node_t *)0x0);
        if (uVar3 != 0xffffffff) {
          printf("%d ",(ulong)-uVar3);
          if (0x31 < ~uVar3) {
            printf("{%d} ",uVar4 & 0xffffffff);
          }
        }
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)pFVar1->nBins);
  }
  putchar(10);
  return;
}

Assistant:

void Fraig_TablePrintStatsS( Fraig_Man_t * pMan )
{
    Fraig_HashTable_t * pT = pMan->pTableS;
    Fraig_Node_t * pNode;
    int i, Counter;

    printf( "Structural table. Table size = %d. Number of entries = %d.\n", pT->nBins, pT->nEntries );
    for ( i = 0; i < pT->nBins; i++ )
    {
        Counter = 0;
        Fraig_TableBinForEachEntryS( pT->pBins[i], pNode )
            Counter++;
        if ( Counter > 1 )
        {
            printf( "%d ", Counter );
            if ( Counter > 50 )
                printf( "{%d} ", i );
        }
    }
    printf( "\n" );
}